

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_feature(lys_ypr_ctx_conflict *pctx,lysp_feature *feat)

{
  int8_t local_19;
  lysp_feature *plStack_18;
  int8_t flag;
  lysp_feature *feat_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_19 = '\0';
  plStack_18 = feat;
  feat_local = (lysp_feature *)pctx;
  ypr_open(pctx,"feature","name",feat->name,'\0');
  *(short *)&feat_local->iffeatures = *(short *)&feat_local->iffeatures + 1;
  yprp_extension_instances
            ((lys_ypr_ctx_conflict *)feat_local,LY_STMT_FEATURE,'\0',plStack_18->exts,&local_19);
  yprp_iffeatures((lys_ypr_ctx_conflict *)feat_local,plStack_18->iffeatures,plStack_18->exts,
                  &local_19);
  ypr_status((lys_ypr_ctx_conflict *)feat_local,plStack_18->flags,plStack_18->exts,&local_19);
  ypr_description((lys_ypr_ctx_conflict *)feat_local,plStack_18->dsc,plStack_18->exts,&local_19);
  ypr_reference((lys_ypr_ctx_conflict *)feat_local,plStack_18->ref,plStack_18->exts,&local_19);
  *(short *)&feat_local->iffeatures = *(short *)&feat_local->iffeatures + -1;
  ypr_close((lys_ypr_ctx_conflict *)feat_local,"feature",local_19);
  return;
}

Assistant:

static void
yprp_feature(struct lys_ypr_ctx *pctx, const struct lysp_feature *feat)
{
    ly_bool flag = 0;

    ly_print_(pctx->out, "%*sfeature %s", INDENT, feat->name);
    LEVEL++;
    yprp_extension_instances(pctx, LY_STMT_FEATURE, 0, feat->exts, &flag);
    yprp_iffeatures(pctx, feat->iffeatures, feat->exts, &flag);
    ypr_status(pctx, feat->flags, feat->exts, &flag);
    ypr_description(pctx, feat->dsc, feat->exts, &flag);
    ypr_reference(pctx, feat->ref, feat->exts, &flag);
    LEVEL--;
    ypr_close(pctx, flag);
}